

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool upb_Arena_IsFused(upb_Arena *a,upb_Arena *b)

{
  upb_ArenaInternal *ai;
  upb_ArenaInternal *ai_00;
  bool bVar1;
  upb_ArenaRoot uVar2;
  
  if (a == b) {
    return true;
  }
  uVar2 = _upb_Arena_FindRoot((upb_ArenaInternal *)(a + 1));
  ai = (upb_ArenaInternal *)(b + 1);
  ai_00 = uVar2.root;
  do {
    uVar2 = _upb_Arena_FindRoot(ai);
    ai = uVar2.root;
    if (ai_00 == ai) {
      return ai_00 == ai;
    }
    uVar2 = _upb_Arena_FindRoot(ai_00);
    bVar1 = ai_00 != uVar2.root;
    ai_00 = uVar2.root;
  } while (bVar1);
  return false;
}

Assistant:

bool upb_Arena_IsFused(const upb_Arena* a, const upb_Arena* b) {
  if (a == b) return true;  // trivial fuse
  upb_ArenaInternal* ra = _upb_Arena_FindRoot(upb_Arena_Internal(a)).root;
  upb_ArenaInternal* rb = upb_Arena_Internal(b);
  while (true) {
    rb = _upb_Arena_FindRoot(rb).root;
    if (ra == rb) return true;
    upb_ArenaInternal* tmp = _upb_Arena_FindRoot(ra).root;
    if (ra == tmp) return false;
    // a's root changed since we last checked.  Retry.
    ra = tmp;
  }
}